

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzP.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChNodeFEAxyzP::NodeIntToDescriptor
          (ChNodeFEAxyzP *this,uint off_v,ChStateDelta *v,ChVectorDynamic<> *R)

{
  double dVar1;
  CoeffReturnType pdVar2;
  Scalar *pSVar3;
  undefined1 *this_00;
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
  local_38 [24];
  
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)v,(ulong)off_v);
  dVar1 = *pdVar2;
  this_00 = &(this->super_ChNodeFEAbase).field_0x18;
  ChVariables::Get_qb((ChVectorRef *)local_38,(ChVariables *)this_00);
  pSVar3 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()(local_38,0);
  *pSVar3 = dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)R,(ulong)off_v);
  dVar1 = *pdVar2;
  ChVariables::Get_fb((ChVectorRef *)local_38,(ChVariables *)this_00);
  pSVar3 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()(local_38,0);
  *pSVar3 = dVar1;
  return;
}

Assistant:

void ChNodeFEAxyzP::NodeIntToDescriptor(const unsigned int off_v, const ChStateDelta& v, const ChVectorDynamic<>& R) {
    variables.Get_qb()(0) = v(off_v);
    variables.Get_fb()(0) = R(off_v);
}